

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbs.c
# Opt level: O1

Wlc_Ntk_t * Wlc_NtkAbstractNodes(Wlc_Ntk_t *p,Vec_Int_t *vNodesInit)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  Vec_Int_t *__ptr;
  long lVar4;
  int *piVar5;
  Wlc_Obj_t *pWVar6;
  Wlc_Ntk_t *pNew;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__8 *paVar7;
  ulong uVar8;
  ulong uVar9;
  
  __ptr = vNodesInit;
  if (vNodesInit == (Vec_Int_t *)0x0) {
    __ptr = Wlc_NtkCollectMultipliers(p);
  }
  if (__ptr == (Vec_Int_t *)0x0) {
    pNew = (Wlc_Ntk_t *)0x0;
  }
  else {
    if (0 < __ptr->nSize) {
      lVar4 = 0;
      do {
        iVar3 = __ptr->pArray[lVar4];
        if (((long)iVar3 < 1) || (p->nObjsAlloc <= iVar3)) goto LAB_002f16a7;
        *(ushort *)(p->pObjs + iVar3) = *(ushort *)(p->pObjs + iVar3) | 0x80;
        lVar4 = lVar4 + 1;
      } while (lVar4 < __ptr->nSize);
    }
    uVar2 = p->nObjsAlloc;
    if ((p->vCopies).nCap < (int)uVar2) {
      piVar5 = (p->vCopies).pArray;
      if (piVar5 == (int *)0x0) {
        piVar5 = (int *)malloc((long)(int)uVar2 << 2);
      }
      else {
        piVar5 = (int *)realloc(piVar5,(long)(int)uVar2 << 2);
      }
      (p->vCopies).pArray = piVar5;
      if (piVar5 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (p->vCopies).nCap = uVar2;
    }
    if (0 < (int)uVar2) {
      memset((p->vCopies).pArray,0,(ulong)uVar2 * 4);
    }
    (p->vCopies).nSize = uVar2;
    if (1 < p->iObj) {
      uVar9 = 1;
      do {
        if ((long)p->nObjsAlloc <= (long)uVar9) {
LAB_002f16a7:
          __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlc.h"
                        ,0x9d,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
        }
        if (uVar9 == (uint)(p->vCopies).nSize) break;
        pWVar6 = p->pObjs + uVar9;
        uVar1 = *(ushort *)pWVar6;
        if ((char)uVar1 < '\0') {
          *(ushort *)pWVar6 = uVar1 & 0xff7f;
          iVar3 = Wlc_ObjAlloc(p,1,uVar1 >> 6 & 1,pWVar6->End - pWVar6->Beg,0);
        }
        else {
          uVar8 = (ulong)pWVar6->nFanins;
          if (0 < (int)pWVar6->nFanins) {
            lVar4 = 0;
            do {
              if ((2 < (uint)uVar8) ||
                 (paVar7 = &pWVar6->field_8,
                 (undefined1  [24])((undefined1  [24])*pWVar6 & (undefined1  [24])0x3f) ==
                 (undefined1  [24])0x6)) {
                paVar7 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__8 *)(pWVar6->field_8).pFanins[0];
              }
              iVar3 = paVar7->Fanins[lVar4];
              if (((long)iVar3 < 0) || ((p->vCopies).nSize <= iVar3)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                              ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              if ((2 < (uint)uVar8) ||
                 (paVar7 = &pWVar6->field_8,
                 (undefined1  [24])((undefined1  [24])*pWVar6 & (undefined1  [24])0x3f) ==
                 (undefined1  [24])0x6)) {
                paVar7 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__8 *)(pWVar6->field_8).pFanins[0];
              }
              paVar7->Fanins[lVar4] = (p->vCopies).pArray[iVar3];
              lVar4 = lVar4 + 1;
              uVar8 = (ulong)(int)pWVar6->nFanins;
            } while (lVar4 < (long)uVar8);
          }
          iVar3 = (int)uVar9;
        }
        if ((long)(p->vCopies).nSize <= (long)uVar9) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        (p->vCopies).pArray[uVar9] = iVar3;
        uVar9 = uVar9 + 1;
      } while ((long)uVar9 < (long)p->iObj);
    }
    if (__ptr != vNodesInit) {
      if (__ptr->pArray != (int *)0x0) {
        free(__ptr->pArray);
        __ptr->pArray = (int *)0x0;
      }
      free(__ptr);
    }
    pNew = Wlc_NtkDupDfs(p);
    Wlc_NtkTransferNames(pNew,p);
  }
  return pNew;
}

Assistant:

Wlc_Ntk_t * Wlc_NtkAbstractNodes( Wlc_Ntk_t * p, Vec_Int_t * vNodesInit )
{
    Vec_Int_t * vNodes = vNodesInit;
    Wlc_Ntk_t * pNew;
    Wlc_Obj_t * pObj;
    int i, k, iObj, iFanin;
    // get multipliers if not given
    if ( vNodes == NULL )
        vNodes = Wlc_NtkCollectMultipliers( p );
    if ( vNodes == NULL )
        return NULL;
    // mark nodes
    Wlc_NtkForEachObjVec( vNodes, p, pObj, i )
        pObj->Mark = 1;
    // iterate through the nodes in the DFS order
    Wlc_NtkCleanCopy( p );
    Wlc_NtkForEachObj( p, pObj, i )
    {
        if ( i == Vec_IntSize(&p->vCopies) )
            break;
        if ( pObj->Mark ) {
            // clean
            pObj->Mark = 0;
            // add fresh PI with the same number of bits
            iObj = Wlc_ObjAlloc( p, WLC_OBJ_PI, Wlc_ObjIsSigned(pObj), Wlc_ObjRange(pObj) - 1, 0 );
        }
        else {
            // update fanins 
            Wlc_ObjForEachFanin( pObj, iFanin, k )
                Wlc_ObjFanins(pObj)[k] = Wlc_ObjCopy(p, iFanin);
            // node to remain
            iObj = i;
        }
        Wlc_ObjSetCopy( p, i, iObj );
    }
    // POs do not change in this procedure
    if ( vNodes != vNodesInit )
        Vec_IntFree( vNodes );
    // reconstruct topological order
    pNew = Wlc_NtkDupDfs( p );
    Wlc_NtkTransferNames( pNew, p );
    return pNew;
}